

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Data>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  WirePointer *pWVar1;
  SegmentReader *pSVar2;
  word *pwVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  WirePointer *pWVar13;
  WirePointer *pWVar14;
  WirePointer *pWVar15;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  ulong uVar16;
  WirePointer *pWVar17;
  bool bVar18;
  Reader RVar19;
  ThrowOverflow local_69;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *local_40;
  SegmentReader *newSegment;
  Fault f_2;
  
  pSVar2 = this->segment;
  pWVar15 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar15 = this->pointer;
  }
  uVar5 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_69);
  pWVar13 = pWVar15 + 1;
  uVar8 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
  lVar11 = (long)((int)uVar8 >> 2);
  if (pSVar2 == (SegmentReader *)0x0) {
    pWVar14 = pWVar13 + lVar11;
  }
  else {
    pwVar3 = (pSVar2->ptr).ptr;
    pWVar14 = (WirePointer *)(pwVar3 + (pSVar2->ptr).size_);
    if (((long)pwVar3 - (long)pWVar13 >> 3 <= lVar11) &&
       (lVar11 <= (long)pWVar14 - (long)pWVar13 >> 3)) {
      pWVar14 = pWVar13 + lVar11;
    }
  }
  pWVar13 = (WirePointer *)defaultValue;
  uVar7 = uVar5;
  if ((pWVar15->field_1).upper32Bits == 0 && uVar8 == 0) goto LAB_0017b0de;
  local_40 = pSVar2;
  if ((pSVar2 == (SegmentReader *)0x0) || ((uVar8 & 3) != 2)) {
LAB_0017aecc:
    if (pWVar14 == (WirePointer *)0x0) goto LAB_0017b0de;
    uVar8 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
    pWVar13 = pWVar14;
LAB_0017aed8:
    uVar8 = uVar8 & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar8);
    _kjCondition.right = anon_var_dwarf_48c59;
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 1);
    if (uVar8 == 1) {
      _kjCondition.left =
           (SegmentReader **)
           (CONCAT71(_kjCondition.left._1_7_,*(byte *)&pWVar15->field_1) & 0xffffffffffffff07);
      _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
      _kjCondition.right = anon_var_dwarf_48c59;
      _kjCondition.op.content.ptr = (char *)0x5;
      bVar18 = (*(byte *)&pWVar15->field_1 & 7) == 2;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar18);
      if (bVar18) {
        uVar7 = (pWVar15->field_1).upper32Bits >> 3;
        if (local_40 == (SegmentReader *)0x0) goto LAB_0017b0de;
        uVar12 = (ulong)(uVar7 + 7 >> 3);
        if (((long)pWVar13 - (long)(local_40->ptr).ptr >> 3) + uVar12 <= (local_40->ptr).size_) {
          uVar16 = local_40->readLimiter->limit;
          if (uVar12 <= uVar16) {
            local_40->readLimiter->limit = uVar16 - uVar12;
            goto LAB_0017b0de;
          }
          (*local_40->arena->_vptr_Arena[3])();
        }
        newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
        this_00 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9e8,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                   "_kjCondition,\"Message contained out-of-bounds data pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [320])
                   "Message contained out-of-bounds data pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
      else {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9e2,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where data was \" \"expected.\""
                   ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [85])
                   "Schema mismatch: Message contains list pointer of non-bytes where data was expected."
                  );
      }
    }
    else {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x9dc,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where data was expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [76])
                 "Schema mismatch: Message contains non-list pointer where data was expected.");
    }
  }
  else {
    iVar6 = (*pSVar2->arena->_vptr_Arena[2])();
    local_40 = (SegmentReader *)CONCAT44(extraout_var,iVar6);
    _kjCondition.left = &local_40;
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_40 != (SegmentReader *)0x0;
    if (local_40 == (SegmentReader *)0x0) {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar8 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
      uVar16 = (ulong)(uVar8 >> 3);
      uVar12 = (local_40->ptr).size_;
      if ((long)uVar12 < (long)uVar16) {
        uVar16 = uVar12;
      }
      uVar10 = 2 - (ulong)((uVar8 & 4) == 0);
      if (uVar16 + uVar10 <= uVar12) {
        pWVar17 = (WirePointer *)((local_40->ptr).ptr + uVar16);
        uVar12 = local_40->readLimiter->limit;
        if (uVar10 <= uVar12) {
          local_40->readLimiter->limit = uVar12 - uVar10;
          if ((*(uint64_t *)&(pWVar15->offsetAndKind).value & 4) != 0) {
            iVar6 = (*local_40->arena->_vptr_Arena[2])
                              (local_40->arena,(ulong)(pWVar17->field_1).upper32Bits);
            newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar6);
            _kjCondition.left = &newSegment;
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = newSegment != (SegmentReader *)0x0;
            if (newSegment == (SegmentReader *)0x0) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_0017b21a:
              pWVar14 = (WirePointer *)0x0;
              kj::_::Debug::Fault::~Fault(&f_2);
            }
            else {
              uVar8 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
              uVar9 = uVar8 & 3;
              _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar9);
              _kjCondition.right = anon_var_dwarf_48c59;
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = (size_t)(uVar9 == 2);
              if (uVar9 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_0017b21a;
              }
              uVar12 = (ulong)(uVar8 >> 3);
              sVar4 = (newSegment->ptr).size_;
              if ((long)sVar4 < (long)uVar12) {
                uVar12 = sVar4;
              }
              pWVar14 = (WirePointer *)((newSegment->ptr).ptr + uVar12);
              local_40 = newSegment;
            }
            pWVar15 = pWVar17 + 1;
            goto LAB_0017aecc;
          }
          pWVar1 = pWVar17 + 1;
          uVar8 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
          lVar11 = (long)((int)uVar8 >> 2);
          pWVar15 = pWVar17;
          if ((local_40 != (SegmentReader *)0x0) &&
             ((pwVar3 = (local_40->ptr).ptr,
              pWVar14 = (WirePointer *)(pwVar3 + (local_40->ptr).size_),
              lVar11 < (long)pwVar3 - (long)pWVar1 >> 3 ||
              ((long)pWVar14 - (long)pWVar1 >> 3 < lVar11)))) goto LAB_0017aecc;
          pWVar13 = pWVar1 + lVar11;
          goto LAB_0017aed8;
        }
        (*local_40->arena->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
  }
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  pWVar13 = (WirePointer *)defaultValue;
  uVar7 = uVar5;
LAB_0017b0de:
  RVar19.super_ArrayPtr<const_unsigned_char>.size_._0_4_ = uVar7;
  RVar19.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)pWVar13;
  RVar19.super_ArrayPtr<const_unsigned_char>.size_._4_4_ = 0;
  return (Reader)RVar19.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader PointerReader::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readDataPointer(segment, ref, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}